

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void traversestrongtable(global_State *g,Table *h)

{
  byte bVar1;
  Node *pNVar2;
  uint local_2c;
  uint i;
  Node *limit;
  Node *n;
  Table *h_local;
  global_State *g_local;
  
  pNVar2 = h->node;
  bVar1 = h->lsizenode;
  for (local_2c = 0; local_2c < h->sizearray; local_2c = local_2c + 1) {
    if (((h->array[local_2c].tt_ & 0x40U) != 0) &&
       (((h->array[local_2c].value_.gc)->marked & 3) != 0)) {
      reallymarkobject(g,h->array[local_2c].value_.gc);
    }
  }
  for (limit = h->node; limit < pNVar2 + (1 << (bVar1 & 0x1f)); limit = limit + 1) {
    if ((limit->i_val).tt_ == 0) {
      removeentry(limit);
    }
    else {
      if ((((limit->i_key).nk.tt_ & 0x40U) != 0) &&
         ((((limit->i_key).nk.value_.gc)->marked & 3) != 0)) {
        reallymarkobject(g,(limit->i_key).nk.value_.gc);
      }
      if ((((limit->i_val).tt_ & 0x40U) != 0) && ((((limit->i_val).value_.gc)->marked & 3) != 0)) {
        reallymarkobject(g,(limit->i_val).value_.gc);
      }
    }
  }
  return;
}

Assistant:

static void traversestrongtable (global_State *g, Table *h) {
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  for (i = 0; i < h->sizearray; i++)  /* traverse array part */
    markvalue(g, &h->array[i]);
  for (n = gnode(h, 0); n < limit; n++) {  /* traverse hash part */
    checkdeadkey(n);
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else {
      lua_assert(!ttisnil(gkey(n)));
      markvalue(g, gkey(n));  /* mark key */
      markvalue(g, gval(n));  /* mark value */
    }
  }
}